

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaa.c
# Opt level: O3

int IDAAGettnSolutionYp(IDAMem IDA_mem,N_Vector yp)

{
  double dVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  double dVar5;
  double dVar6;
  sunrealtype sVar7;
  double dVar8;
  
  if (IDA_mem->ida_nst != 0) {
    uVar4 = IDA_mem->ida_kused + (uint)(IDA_mem->ida_kused == 0);
    if (0 < (int)uVar4) {
      dVar5 = 1.0;
      dVar6 = 0.0;
      uVar3 = 0;
      dVar8 = 0.0;
      sVar7 = IDA_mem->ida_psi[0];
      do {
        dVar8 = dVar8 * dVar6 + dVar5 / sVar7;
        dVar5 = dVar5 * dVar6;
        dVar1 = IDA_mem->ida_psi[uVar3 + 1];
        dVar6 = sVar7 / dVar1;
        IDA_mem->ida_dvals[uVar3] = dVar8;
        uVar3 = uVar3 + 1;
        sVar7 = dVar1;
      } while (uVar4 != uVar3);
    }
    iVar2 = N_VLinearCombination((ulong)uVar4,IDA_mem->ida_dvals,IDA_mem->ida_phi + 1);
    return iVar2;
  }
  iVar2 = N_VScale(0x3ff0000000000000,IDA_mem->ida_phi[1],yp);
  return iVar2;
}

Assistant:

static int IDAAGettnSolutionYp(IDAMem IDA_mem, N_Vector yp)
{
  int j, kord, retval;
  sunrealtype C, D, gam;

  if (IDA_mem->ida_nst == 0)
  {
    /* If no integration was done, return the yp supplied by user.*/
    N_VScale(ONE, IDA_mem->ida_phi[1], yp);

    return (0);
  }

  /* Compute yp as in IDAGetSolution for this particular case when t=tn. */

  kord = IDA_mem->ida_kused;
  if (IDA_mem->ida_kused == 0) { kord = 1; }

  C   = ONE;
  D   = ZERO;
  gam = ZERO;
  for (j = 1; j <= kord; j++)
  {
    D   = D * gam + C / IDA_mem->ida_psi[j - 1];
    C   = C * gam;
    gam = IDA_mem->ida_psi[j - 1] / IDA_mem->ida_psi[j];

    IDA_mem->ida_dvals[j - 1] = D;
  }

  retval = N_VLinearCombination(kord, IDA_mem->ida_dvals, IDA_mem->ida_phi + 1,
                                yp);
  if (retval != IDA_SUCCESS) { return (IDA_VECTOROP_ERR); }

  return (0);
}